

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqrtx.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  ostream *poVar2;
  Solution solution;
  
  iVar1 = Solution::mySqrt(&solution,0);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = Solution::mySqrt(&solution,1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = Solution::mySqrt(&solution,2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = Solution::mySqrt(&solution,3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = Solution::mySqrt(&solution,4);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = Solution::mySqrt(&solution,9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar1 = Solution::mySqrt(&solution,10);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Solution solution;

	cout << solution.mySqrt(0) << endl;
	cout << solution.mySqrt(1) << endl;
	cout << solution.mySqrt(2) << endl;
	cout << solution.mySqrt(3) << endl;
	cout << solution.mySqrt(4) << endl;

	cout << solution.mySqrt(9) << endl;
	cout << solution.mySqrt(10) << endl;

	return 0;
}